

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

void make_canonical_list(PathCompList_t *in_list,PathCompList_t *out_list)

{
  const_iterator this;
  bool bVar1;
  reference pbVar2;
  _Self local_30;
  _List_node_base *local_28;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  const_iterator i;
  PathCompList_t *out_list_local;
  PathCompList_t *in_list_local;
  
  i._M_node = (_List_node_base *)out_list;
  std::
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_List_const_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_list);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_list);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pbVar2 = std::
             _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    bVar1 = std::operator==(pbVar2,"..");
    if (bVar1) {
      bVar1 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)i._M_node);
      if (!bVar1) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)i._M_node);
      }
    }
    else {
      pbVar2 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      bVar1 = std::operator!=(pbVar2,".");
      this = i;
      if (bVar1) {
        pbVar2 = std::
                 _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this._M_node,pbVar2);
      }
    }
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

static void
make_canonical_list(const PathCompList_t& in_list, PathCompList_t& out_list)
{
  PathCompList_t::const_iterator i;
  for ( i = in_list.begin(); i != in_list.end(); ++i )
    {
      if ( *i == ".." )
	{
	  if ( ! out_list.empty() )
	    {
	      out_list.pop_back();
	    }
	}
      else if ( *i != "." )
	{
	  out_list.push_back(*i);
	}
    }
}